

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O2

TabletPointData * QGuiApplicationPrivate::tabletDevicePoint(qint64 deviceId)

{
  long lVar1;
  pointer pTVar2;
  iterator iVar3;
  TabletPointData *pTVar4;
  long lVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  TabletPointData local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = 0xffffffffffffffff;
  lVar1 = -0x18;
  do {
    lVar5 = lVar1;
    uVar6 = uVar6 + 1;
    if ((ulong)tabletDevicePoints.d.size <= uVar6) {
      local_48.state.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
      super_QFlagsStorage<Qt::MouseButton>.i =
           (QFlagsStorageHelper<Qt::MouseButton,_4>)(QFlagsStorage<Qt::MouseButton>)0x0;
      local_48.target = (QWindow *)0x0;
      local_48.deviceId = deviceId;
      QList<QGuiApplicationPrivate::TabletPointData>::
      emplaceBack<QGuiApplicationPrivate::TabletPointData>(&tabletDevicePoints,&local_48);
      iVar3 = QList<QGuiApplicationPrivate::TabletPointData>::end(&tabletDevicePoints);
      pTVar4 = iVar3.i + -1;
      goto LAB_002afe64;
    }
    pTVar2 = QList<QGuiApplicationPrivate::TabletPointData>::data(&tabletDevicePoints);
    lVar1 = lVar5 + 0x18;
  } while (*(long *)((long)&pTVar2[1].deviceId + lVar5) != deviceId);
  pTVar4 = (TabletPointData *)((long)&pTVar2[1].deviceId + lVar5);
LAB_002afe64:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pTVar4;
  }
  __stack_chk_fail();
}

Assistant:

QGuiApplicationPrivate::TabletPointData &QGuiApplicationPrivate::tabletDevicePoint(qint64 deviceId)
{
    for (int i = 0; i < tabletDevicePoints.size(); ++i) {
        TabletPointData &pointData = tabletDevicePoints[i];
        if (pointData.deviceId == deviceId)
            return pointData;
    }

    tabletDevicePoints.append(TabletPointData(deviceId));
    return tabletDevicePoints.last();
}